

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool BasePort::ParseProtocol(char *arg,ProtocolType *protocol,ostream *ostr)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string name;
  ostream *ostr_local;
  ProtocolType *protocol_local;
  char *arg_local;
  
  name.field_2._8_8_ = ostr;
  if ((arg != (char *)0x0) && (sVar2 = strlen(arg), sVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,arg,&local_49);
    std::allocator<char>::~allocator(&local_49);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"sequential-read-write");
    if ((bVar1) ||
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"srw"), bVar1)) {
      *protocol = PROTOCOL_SEQ_RW;
      arg_local._7_1_ = true;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"sequential-read-broadcast-write");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48,"srbw"), bVar1)) {
        *protocol = PROTOCOL_SEQ_R_BC_W;
        arg_local._7_1_ = true;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"broadcast-read-write");
        if ((((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_48,"brw"), bVar1)) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_48,"broadcast-query-read-write"), bVar1)) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48,"bqrw"), bVar1)) {
          *protocol = PROTOCOL_BC_QRW;
          arg_local._7_1_ = true;
        }
        else {
          poVar3 = std::operator<<((ostream *)name.field_2._8_8_,"ParseProtocol: no protocol \"");
          poVar3 = std::operator<<(poVar3,(string *)local_48);
          poVar3 = std::operator<<(poVar3,
                                   "\" is not supported, use sequential-read-write, srw, sequential-read-broadcast-write, srbw, broadcast-query-read-write or bqrw"
                                  );
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          arg_local._7_1_ = false;
        }
      }
    }
    std::__cxx11::string::~string((string *)local_48);
    return arg_local._7_1_;
  }
  poVar3 = std::operator<<((ostream *)name.field_2._8_8_,"ParseProtocol: no protocol provided");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool BasePort::ParseProtocol(const char * arg, ProtocolType & protocol,
                             std::ostream & ostr)
{
    // no option, using default
    if ((arg == 0) || (strlen(arg) == 0)) {
        ostr << "ParseProtocol: no protocol provided" << std::endl;
        return false;
    }
    // convert arg to string
    std::string name(arg);

    // this could likely be implemented using a static map
    if ((name == "sequential-read-write") ||
        (name == "srw")) {
        protocol = PROTOCOL_SEQ_RW;
        return true;
    } else if ((name == "sequential-read-broadcast-write") ||
               (name == "srbw")) {
        protocol = PROTOCOL_SEQ_R_BC_W;
        return true;
    } else if ((name == "broadcast-read-write") ||
               (name == "brw") ||
               (name == "broadcast-query-read-write") ||
               (name == "bqrw")) {
        protocol = PROTOCOL_BC_QRW;
        return true;
    }
    ostr << "ParseProtocol: no protocol \"" << name << "\" is not supported, use sequential-read-write, srw, sequential-read-broadcast-write, srbw, broadcast-query-read-write or bqrw" << std::endl;
    return false;
}